

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrandr.c
# Opt level: O1

xrandr_mode * xrandr_fetch_mode(ALLEGRO_SYSTEM_XGLX *s,int sid,RRMode id)

{
  void *pvVar1;
  xrandr_mode *pxVar2;
  ulong uVar3;
  
  pvVar1 = _al_vector_ref(&s->xrandr_screens,sid);
  if (*(long *)((long)pvVar1 + 0x68) != 0) {
    uVar3 = 0;
    do {
      pxVar2 = (xrandr_mode *)_al_vector_ref((_AL_VECTOR *)((long)pvVar1 + 0x58),(uint)uVar3);
      if (pxVar2->id == id) {
        return pxVar2;
      }
      uVar3 = (ulong)((uint)uVar3 + 1);
    } while (uVar3 < *(ulong *)((long)pvVar1 + 0x68));
  }
  return (xrandr_mode *)0x0;
}

Assistant:

static xrandr_mode *xrandr_fetch_mode(ALLEGRO_SYSTEM_XGLX *s, int sid, RRMode id)
{
   unsigned int i;
   
   xrandr_screen *screen = _al_vector_ref(&s->xrandr_screens, sid);

   for(i = 0; i < _al_vector_size(&screen->modes); i++) {
      xrandr_mode *mode = _al_vector_ref(&screen->modes, i);
      if(mode->id == id)
         return mode;
   }
   
   return NULL;
}